

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool.c
# Opt level: O3

void mempool_create_with_order(mempool *pool,slab_cache *cache,uint32_t objsize,uint8_t order)

{
  undefined1 uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  
  if (cache->order_max < order) {
    __assert_fail("order <= cache->order_max",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/mempool.c"
                  ,0x9f,
                  "void mempool_create_with_order(struct mempool *, struct slab_cache *, uint32_t, uint8_t)"
                 );
  }
  pool->cache = cache;
  (pool->slabs).slabs.next = &(pool->slabs).slabs;
  (pool->slabs).slabs.prev = &(pool->slabs).slabs;
  (pool->slabs).stats.used = 0;
  (pool->slabs).stats.total = 0;
  (pool->hot_slabs).rbt_root = (mslab *)0x0;
  pool->first_hot_slab = (mslab *)0x0;
  (pool->cold_slabs).next = &pool->cold_slabs;
  (pool->cold_slabs).prev = &pool->cold_slabs;
  pool->spare = (mslab *)0x0;
  pool->objsize = objsize;
  pool->slab_order = order;
  if (order <= cache->order_max) {
    uVar1 = cache->order0_size_lb;
    lVar5 = 1L << (order + uVar1 & 0x3f);
    iVar2 = (int)lVar5;
    uVar4 = iVar2 - 0x70;
    uVar3 = uVar4 / objsize;
    pool->objcount = uVar3;
    if (objsize <= uVar4) {
      pool->offset = iVar2 - uVar3 * objsize;
      pool->slab_ptr_mask = -lVar5;
      pool->small_mempool = (small_mempool *)0x0;
      return;
    }
    __assert_fail("pool->objcount",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/mempool.c"
                  ,0xac,
                  "void mempool_create_with_order(struct mempool *, struct slab_cache *, uint32_t, uint8_t)"
                 );
  }
  __assert_fail("order <= cache->order_max",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/slab_cache.h"
                ,0xee,"intptr_t slab_order_size(struct slab_cache *, uint8_t)");
}

Assistant:

void
mempool_create_with_order(struct mempool *pool, struct slab_cache *cache,
			  uint32_t objsize, uint8_t order)
{
	assert(order <= cache->order_max);
	pool->cache = cache;
	slab_list_create(&pool->slabs);
	mslab_tree_new(&pool->hot_slabs);
	pool->first_hot_slab = NULL;
	rlist_create(&pool->cold_slabs);
	pool->spare = NULL;
	pool->objsize = objsize;
	pool->slab_order = order;
	/* Total size of slab */
	uint32_t slab_size = slab_order_size(pool->cache, pool->slab_order);
	/* Calculate how many objects will actually fit in a slab. */
	pool->objcount = (slab_size - mslab_sizeof()) / objsize;
	assert(pool->objcount);
	pool->offset = slab_size - pool->objcount * pool->objsize;
	pool->slab_ptr_mask = ~(slab_order_size(cache, order) - 1);
	pool->small_mempool = NULL;
}